

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

ssize_t __thiscall TCPSocket::send(TCPSocket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int code;
  ssize_t sVar1;
  int *piVar2;
  IOError *this_00;
  ConnectionClosed *this_01;
  undefined4 in_register_00000034;
  pointer_____offset_0x10___ *ppuVar3;
  string local_48;
  
  if (this->hasRemote == false) {
    this_01 = (ConnectionClosed *)__cxa_allocate_exception(0x30);
    NoRemote::NoRemote((NoRemote *)this_01);
    ppuVar3 = &NoRemote::typeinfo;
  }
  else {
    sVar1 = write((this->super_Socket).socketDescriptor,(void *)CONCAT44(in_register_00000034,__fd),
                  (long)(int)__buf);
    if ((int)sVar1 < 0) {
      piVar2 = __errno_location();
      code = *piVar2;
      this_00 = (IOError *)__cxa_allocate_exception(0x30);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48," - could not send","");
      IOError::IOError(this_00,&local_48,code);
      __cxa_throw(this_00,&IOError::typeinfo,TCPSocketError::~TCPSocketError);
    }
    if ((int)sVar1 != 0) {
      return sVar1;
    }
    this_01 = (ConnectionClosed *)__cxa_allocate_exception(0x30);
    ConnectionClosed::ConnectionClosed(this_01);
    ppuVar3 = &ConnectionClosed::typeinfo;
  }
  __cxa_throw(this_01,ppuVar3,TCPSocketError::~TCPSocketError);
}

Assistant:

int TCPSocket::send(const char *buffer, int size)
{
    if(!hasRemote)
    {
        throw NoRemote();
    }

    int sent = ::write(socketDescriptor, buffer, size);
    if(sent < 0){
        int x = errno;
        throw IOError(" - could not send", x);
    }
    else if(sent == 0){
        throw ConnectionClosed();
    }

    return sent;
}